

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
despot::Parser::ComputeState
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Parser *this,int index)

{
  pointer piVar1;
  pointer pSVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  allocator_type local_19;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             ((long)(this->curr_state_vars_).
                    super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->curr_state_vars_).
                   super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0xc0,&local_19);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->curr_state_vars_).
           super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2 & 0xffffffff;
  while( true ) {
    uVar3 = uVar3 - 1;
    if ((int)(uint)uVar3 < 0) break;
    uVar4 = (uint)uVar3 & 0x7fffffff;
    iVar5 = (int)((ulong)((long)*(pointer *)
                                 ((long)&pSVar2[uVar4].super_NamedVar.super_Variable.values_ + 8) -
                         *(long *)&pSVar2[uVar4].super_NamedVar.super_Variable.values_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data) >> 5);
    piVar1[uVar4] = index % iVar5;
    index = index / iVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Parser::ComputeState(int index) const {
	vector<int> state(curr_state_vars_.size());
	for (int s = state.size() - 1; s >= 0; s--) {
		state[s] = index % curr_state_vars_[s].Size();
		index /= curr_state_vars_[s].Size();
	}

	return state;
}